

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::sized_declarations_invalid_sizes2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (sized_declarations_invalid_sizes2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  long lVar1;
  allocator<char> local_236;
  allocator<char> local_235;
  allocator<char> local_234;
  allocator<char> local_233;
  allocator<char> local_232;
  allocator<char> local_231;
  allocator<char> local_230;
  allocator<char> local_22f;
  allocator<char> local_22e;
  allocator<char> local_22d;
  allocator<char> local_22c;
  allocator<char> local_22b;
  allocator<char> local_22a;
  allocator<char> local_229;
  string shader_source;
  string invalid_declarations [15];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)invalid_declarations,"    float x[2][2][2][-1];\n",
             (allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations + 1),"    float x[2][2][-1][2];\n",&local_229);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations + 2),"    float x[2][-1][2][2];\n",&local_22a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations + 3),"    float x[-1][2][2][2];\n",&local_22b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations + 4),"    float x[2][2][-1][-1];\n",&local_22c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations + 5),"    float x[2][-1][2][-1];\n",&local_22d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations + 6),"    float x[-1][2][2][-1];\n",&local_22e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations + 7),"    float x[2][-1][-1][2];\n",&local_22f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations + 8),"    float x[-1][2][-1][2];\n",&local_230);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations + 9),"    float x[-1][-1][2][2];\n",&local_231);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations + 10),"    float x[2][-1][-1][-1];\n",&local_232);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations + 0xb),"    float x[-1][2][-1][-1];\n",&local_233);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations + 0xc),"    float x[-1][-1][2][-1];\n",&local_234);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations + 0xd),"    float x[-1][-1][-1][2];\n",&local_235);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_declarations + 0xe),"    float x[-1][-1][-1][-1];\n",&local_236);
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&shader_source);
  std::__cxx11::string::append((string *)&shader_source);
  switch((ulong)tested_shader_type) {
  case 0:
  case 2:
  case 5:
    goto switchD_00b78ff3_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    goto switchD_00b78ff3_caseD_0;
  case 3:
    break;
  case 4:
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x72d);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::append((string *)&shader_source);
switchD_00b78ff3_caseD_0:
  std::__cxx11::string::append((string *)&shader_source);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[8])(this,(ulong)tested_shader_type,&shader_source);
  std::__cxx11::string::~string((string *)&shader_source);
  lVar1 = 0x1c0;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&invalid_declarations[0]._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

void sized_declarations_invalid_sizes2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string invalid_declarations[] = {
		"    float x[2][2][2][-1];\n",   "    float x[2][2][-1][2];\n",   "    float x[2][-1][2][2];\n",
		"    float x[-1][2][2][2];\n",   "    float x[2][2][-1][-1];\n",  "    float x[2][-1][2][-1];\n",
		"    float x[-1][2][2][-1];\n",  "    float x[2][-1][-1][2];\n",  "    float x[-1][2][-1][2];\n",
		"    float x[-1][-1][2][2];\n",  "    float x[2][-1][-1][-1];\n", "    float x[-1][2][-1][-1];\n",
		"    float x[-1][-1][2][-1];\n", "    float x[-1][-1][-1][2];\n", "    float x[-1][-1][-1][-1];\n"
	};

	for (size_t invalid_declarations_index = 0;
		 invalid_declarations_index < sizeof(invalid_declarations) / sizeof(invalid_declarations);
		 invalid_declarations_index++)
	{
		std::string shader_source;

		shader_source = shader_start;
		shader_source += invalid_declarations[invalid_declarations_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		this->execute_negative_test(tested_shader_type, shader_source);
	} /* for (int invalid_declarations_index = 0; ...) */
}